

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

size_t __thiscall docopt::LeafPattern::hash(LeafPattern *this)

{
  size_t local_18;
  size_t seed;
  LeafPattern *this_local;
  
  seed = (size_t)this;
  if (this == (LeafPattern *)0x0) {
    __cxa_bad_typeid();
  }
  local_18 = std::type_info::hash_code((type_info *)(this->super_Pattern)._vptr_Pattern[-1]);
  hash_combine<std::__cxx11::string>(&local_18,&this->fName);
  hash_combine<docopt::value>(&local_18,&this->fValue);
  return local_18;
}

Assistant:

virtual size_t hash() const override {
			size_t seed = typeid(*this).hash_code();
			hash_combine(seed, fName);
			hash_combine(seed, fValue);
			return seed;
		}